

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgunt(fitsfile *fptr,char *keyname,char *unit,int *status)

{
  char *pcVar1;
  int *in_RCX;
  char *in_RDX;
  char *loc;
  char comm [73];
  char valstring [71];
  char local_c8;
  char acStackY_c7 [63];
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  int local_4;
  
  if (*in_RCX < 1) {
    ffgkey(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
           in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (local_c8 == '[') {
      pcVar1 = strchr(&local_c8,0x5d);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      strcpy(in_RDX,acStackY_c7);
    }
    else {
      *in_RDX = '\0';
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgunt( fitsfile *fptr,     /* I - FITS file pointer         */
            const char *keyname,      /* I - name of keyword to read   */
            char *unit,         /* O - keyword units             */
            int  *status)       /* IO - error status             */
/*
    Read (get) the units string from the comment field of the existing
    keyword. This routine uses a local FITS convention (not defined in the
    official FITS standard) in which the units are enclosed in 
    square brackets following the '/' comment field delimiter, e.g.:

    KEYWORD =                   12 / [kpc] comment string goes here
*/
{
    char valstring[FLEN_VALUE];
    char comm[FLEN_COMMENT];
    char *loc;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    if (comm[0] == '[')
    {
        loc = strchr(comm, ']');   /*  find the closing bracket */
        if (loc)
            *loc = '\0';           /*  terminate the string */

        strcpy(unit, &comm[1]);    /*  copy the string */
     }
     else
        unit[0] = '\0';
 
    return(*status);
}